

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O0

void __thiscall QGraphicsItemPrivate::ensureSortedChildren(QGraphicsItemPrivate *this)

{
  iterator __last;
  bool bVar1;
  iterator __first;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  long in_RDI;
  int i;
  _func_bool_QGraphicsItem_ptr_QGraphicsItem_ptr *in_stack_ffffffffffffffc8;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  if ((*(ulong *)(in_RDI + 0x160) >> 0x1d & 1) != 0) {
    *(ulong *)(in_RDI + 0x160) = *(ulong *)(in_RDI + 0x160) & 0xffffffffdfffffff;
    *(uint *)(in_RDI + 0x168) = *(uint *)(in_RDI + 0x168) & 0xffffffdf | 0x20;
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x99448a);
    if (!bVar1) {
      QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffffd0);
      __first = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffffd0);
      __last.i._4_4_ = in_stack_ffffffffffffffe4;
      __last.i._0_4_ = in_stack_ffffffffffffffe0;
      std::sort<QList<QGraphicsItem*>::iterator,bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>
                (__first,__last,in_stack_ffffffffffffffc8);
      iVar5 = 0;
      while( true ) {
        this_00 = (QList<QGraphicsItem_*> *)(long)iVar5;
        qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x98));
        if (qVar2 <= (long)this_00) break;
        ppQVar3 = QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffc8);
        pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&(*ppQVar3)->d_ptr);
        if (pQVar4->siblingIndex != iVar5) {
          *(uint *)(in_RDI + 0x168) = *(uint *)(in_RDI + 0x168) & 0xffffffdf;
          return;
        }
        iVar5 = iVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

inline void QGraphicsItemPrivate::ensureSortedChildren()
{
    if (needSortChildren) {
        needSortChildren = 0;
        sequentialOrdering = 1;
        if (children.isEmpty())
            return;
        std::sort(children.begin(), children.end(), qt_notclosestLeaf);
        for (int i = 0; i < children.size(); ++i) {
            if (children.at(i)->d_ptr->siblingIndex != i) {
                sequentialOrdering = 0;
                break;
            }
        }
    }
}